

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O3

void __thiscall VCToolBase::parseOptions(VCToolBase *this,ProStringList *options)

{
  char *pcVar1;
  const_iterator copy;
  ProString *this_00;
  long in_FS_OFFSET;
  QByteArray local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((options->super_QList<ProString>).d.size != 0) {
    this_00 = (options->super_QList<ProString>).d.ptr;
    do {
      ProString::toLatin1(&local_48,this_00);
      pcVar1 = local_48.d.ptr;
      if (local_48.d.ptr == (char *)0x0) {
        pcVar1 = (char *)&QByteArray::_empty;
      }
      (*this->_vptr_VCToolBase[2])(this,pcVar1);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,1,0x10);
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 !=
             (options->super_QList<ProString>).d.ptr + (options->super_QList<ProString>).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void parseOptions(const ProStringList& options) {
        for (ProStringList::ConstIterator it=options.begin(); (it!=options.end()); it++)
            parseOption((*it).toLatin1().constData());
    }